

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

bool __thiscall
HighsLpRelaxation::computeDualInfProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *inds
          ,vector<double,_std::allocator<double>_> *vals,double *rhs)

{
  long in_RDI;
  undefined8 *in_R8;
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  
  bVar1 = (*(byte *)(in_RDI + 0x5358) & 1) != 0;
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_00000070,
               (vector<int,_std::allocator<int>_> *)in_stack_00000068);
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
    *in_R8 = *(undefined8 *)(in_RDI + 0x5350);
  }
  return bVar1;
}

Assistant:

bool HighsLpRelaxation::computeDualInfProof(const HighsDomain& globaldomain,
                                            std::vector<HighsInt>& inds,
                                            std::vector<double>& vals,
                                            double& rhs) {
  if (!hasdualproof) return false;

  assert(std::isfinite(dualproofrhs));

  inds = dualproofinds;
  vals = dualproofvals;
  rhs = dualproofrhs;
  return true;
}